

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_gvec_cmp_mips64
               (TCGContext_conflict5 *tcg_ctx,TCGCond cond,uint vece,uint32_t dofs,uint32_t aofs,
               uint32_t bofs,uint32_t oprsz,uint32_t maxsz)

{
  _Bool _Var1;
  TCGType TVar2;
  uint oprsz_00;
  TCGCond TVar3;
  TCGOpcode *n;
  undefined1 **ppuStack_40;
  uint32_t tmp;
  undefined1 **fn;
  uint32_t some;
  TCGType type;
  TCGOpcode *hold_list;
  uint32_t local_20;
  uint32_t bofs_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  uint vece_local;
  TCGCond cond_local;
  TCGContext_conflict5 *tcg_ctx_local;
  
  check_size_align(oprsz,maxsz,dofs | aofs | bofs);
  check_overlap_3(dofs,aofs,bofs,maxsz);
  if ((cond == TCG_COND_NEVER) || (cond == TCG_COND_ALWAYS)) {
    do_dup(tcg_ctx,0,dofs,oprsz,maxsz,(TCGv_i32)0x0,(TCGv_i64)0x0,
           (long)(int)-(uint)(cond == TCG_COND_ALWAYS));
    return;
  }
  n = tcg_swap_vecop_list(tcg_gen_gvec_cmp_mips64::cmp_list);
  TVar2 = choose_vector_type(tcg_ctx,tcg_gen_gvec_cmp_mips64::cmp_list,vece,oprsz,vece == 3);
  hold_list._4_4_ = bofs;
  local_20 = aofs;
  bofs_local = dofs;
  switch(TVar2) {
  case TCG_TYPE_I32:
    if ((vece == 3) && (_Var1 = check_size_impl(oprsz,8), _Var1)) {
      expand_cmp_i64(tcg_ctx,dofs,aofs,bofs,oprsz,cond);
    }
    else if ((vece == 2) && (_Var1 = check_size_impl(oprsz,4), _Var1)) {
      expand_cmp_i32(tcg_ctx,dofs,aofs,bofs,oprsz,cond);
    }
    else {
      ppuStack_40 = tcg_gen_gvec_cmp_mips64::fns[cond];
      if (ppuStack_40 == (undefined1 **)0x0) {
        TVar3 = tcg_swap_cond(cond);
        ppuStack_40 = tcg_gen_gvec_cmp_mips64::fns[TVar3];
        hold_list._4_4_ = aofs;
        local_20 = bofs;
        if (ppuStack_40 == (undefined1 **)0x0) {
          __assert_fail("fn != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                        ,0xc90,
                        "void tcg_gen_gvec_cmp_mips64(TCGContext *, TCGCond, unsigned int, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t)"
                       );
        }
      }
      tcg_gen_gvec_3_ool_mips64
                (tcg_ctx,dofs,local_20,hold_list._4_4_,oprsz,maxsz,0,ppuStack_40[vece]);
      oprsz = maxsz;
    }
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
               ,0xc98,(char *)0x0);
  case TCG_TYPE_V64:
    expand_cmp_vec(tcg_ctx,vece,dofs,aofs,bofs,oprsz,8,TCG_TYPE_V64,cond);
    break;
  case TCG_TYPE_V256:
    oprsz_00 = oprsz & 0xffffffe0;
    expand_cmp_vec(tcg_ctx,vece,dofs,aofs,bofs,oprsz_00,0x20,TCG_TYPE_V256,cond);
    if (oprsz_00 == oprsz) break;
    bofs_local = oprsz_00 + dofs;
    local_20 = oprsz_00 + aofs;
    hold_list._4_4_ = oprsz_00 + bofs;
    oprsz = oprsz - oprsz_00;
    maxsz = maxsz - oprsz_00;
  case TCG_TYPE_V128:
    expand_cmp_vec(tcg_ctx,vece,bofs_local,local_20,hold_list._4_4_,oprsz,0x10,TCG_TYPE_V128,cond);
  }
  tcg_swap_vecop_list(n);
  if (oprsz < maxsz) {
    expand_clr(tcg_ctx,bofs_local + oprsz,maxsz - oprsz);
  }
  return;
}

Assistant:

void tcg_gen_gvec_cmp(TCGContext *tcg_ctx, TCGCond cond, unsigned vece, uint32_t dofs,
                      uint32_t aofs, uint32_t bofs,
                      uint32_t oprsz, uint32_t maxsz)
{
    static const TCGOpcode cmp_list[] = { INDEX_op_cmp_vec, 0 };
    static gen_helper_gvec_3 * const eq_fn[4] = {
        gen_helper_gvec_eq8, gen_helper_gvec_eq16,
        gen_helper_gvec_eq32, gen_helper_gvec_eq64
    };
    static gen_helper_gvec_3 * const ne_fn[4] = {
        gen_helper_gvec_ne8, gen_helper_gvec_ne16,
        gen_helper_gvec_ne32, gen_helper_gvec_ne64
    };
    static gen_helper_gvec_3 * const lt_fn[4] = {
        gen_helper_gvec_lt8, gen_helper_gvec_lt16,
        gen_helper_gvec_lt32, gen_helper_gvec_lt64
    };
    static gen_helper_gvec_3 * const le_fn[4] = {
        gen_helper_gvec_le8, gen_helper_gvec_le16,
        gen_helper_gvec_le32, gen_helper_gvec_le64
    };
    static gen_helper_gvec_3 * const ltu_fn[4] = {
        gen_helper_gvec_ltu8, gen_helper_gvec_ltu16,
        gen_helper_gvec_ltu32, gen_helper_gvec_ltu64
    };
    static gen_helper_gvec_3 * const leu_fn[4] = {
        gen_helper_gvec_leu8, gen_helper_gvec_leu16,
        gen_helper_gvec_leu32, gen_helper_gvec_leu64
    };
    static gen_helper_gvec_3 * const * const fns[16] = {
        [TCG_COND_EQ] = eq_fn,
        [TCG_COND_NE] = ne_fn,
        [TCG_COND_LT] = lt_fn,
        [TCG_COND_LE] = le_fn,
        [TCG_COND_LTU] = ltu_fn,
        [TCG_COND_LEU] = leu_fn,
    };

    const TCGOpcode *hold_list;
    TCGType type;
    uint32_t some;

    check_size_align(oprsz, maxsz, dofs | aofs | bofs);
    check_overlap_3(dofs, aofs, bofs, maxsz);

    if (cond == TCG_COND_NEVER || cond == TCG_COND_ALWAYS) {
        do_dup(tcg_ctx, MO_8, dofs, oprsz, maxsz,
               NULL, NULL, -(cond == TCG_COND_ALWAYS));
        return;
    }

    /*
     * Implement inline with a vector type, if possible.
     * Prefer integer when 64-bit host and 64-bit comparison.
     */
    hold_list = tcg_swap_vecop_list(cmp_list);
    type = choose_vector_type(tcg_ctx, cmp_list, vece, oprsz,
                              TCG_TARGET_REG_BITS == 64 && vece == MO_64);
    switch (type) {
    case TCG_TYPE_V256:
        /* Recall that ARM SVE allows vector sizes that are not a
         * power of 2, but always a multiple of 16.  The intent is
         * that e.g. size == 80 would be expanded with 2x32 + 1x16.
         */
        some = QEMU_ALIGN_DOWN(oprsz, 32);
        expand_cmp_vec(tcg_ctx, vece, dofs, aofs, bofs, some, 32, TCG_TYPE_V256, cond);
        if (some == oprsz) {
            break;
        }
        dofs += some;
        aofs += some;
        bofs += some;
        oprsz -= some;
        maxsz -= some;
        /* fallthru */
    case TCG_TYPE_V128:
        expand_cmp_vec(tcg_ctx, vece, dofs, aofs, bofs, oprsz, 16, TCG_TYPE_V128, cond);
        break;
    case TCG_TYPE_V64:
        expand_cmp_vec(tcg_ctx, vece, dofs, aofs, bofs, oprsz, 8, TCG_TYPE_V64, cond);
        break;

    case 0:
        if (vece == MO_64 && check_size_impl(oprsz, 8)) {
            expand_cmp_i64(tcg_ctx, dofs, aofs, bofs, oprsz, cond);
        } else if (vece == MO_32 && check_size_impl(oprsz, 4)) {
            expand_cmp_i32(tcg_ctx, dofs, aofs, bofs, oprsz, cond);
        } else {
            gen_helper_gvec_3 * const *fn = fns[cond];

            if (fn == NULL) {
                uint32_t tmp;
                tmp = aofs, aofs = bofs, bofs = tmp;
                cond = tcg_swap_cond(cond);
                fn = fns[cond];
                assert(fn != NULL);
            }
            tcg_gen_gvec_3_ool(tcg_ctx, dofs, aofs, bofs, oprsz, maxsz, 0, fn[vece]);
            oprsz = maxsz;
        }
        break;

    default:
        g_assert_not_reached();
    }
    tcg_swap_vecop_list(hold_list);

    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}